

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ChildWindowComparer(void *lhs,void *rhs)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = *(uint *)(*lhs + 0xc);
  uVar2 = *(uint *)(*rhs + 0xc);
  iVar3 = (uVar1 & 0x2000000) - (uVar2 & 0x2000000);
  if (((iVar3 == 0) && (iVar3 = (uVar1 & 0x1000000) - (uVar2 & 0x1000000), iVar3 == 0)) &&
     (iVar3 = (uVar1 & 0x800000) - (uVar2 & 0x800000), iVar3 == 0)) {
    return *(int *)(*lhs + 0x10) - *(int *)(*rhs + 0x10);
  }
  return iVar3;
}

Assistant:

static int ChildWindowComparer(const void* lhs, const void* rhs)
{
    const ImGuiWindow* a = *(const ImGuiWindow**)lhs;
    const ImGuiWindow* b = *(const ImGuiWindow**)rhs;
    if (int d = (a->Flags & ImGuiWindowFlags_Popup) - (b->Flags & ImGuiWindowFlags_Popup))
        return d;
    if (int d = (a->Flags & ImGuiWindowFlags_Tooltip) - (b->Flags & ImGuiWindowFlags_Tooltip))
        return d;
    if (int d = (a->Flags & ImGuiWindowFlags_ComboBox) - (b->Flags & ImGuiWindowFlags_ComboBox))
        return d;
    return (a->IndexWithinParent - b->IndexWithinParent);
}